

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap.cpp
# Opt level: O0

Error * ot::commissioner::coap::Message::Deserialize
                  (Error *__return_storage_ptr__,Header *aHeader,ByteArray *aBuf,size_t *aOffset)

{
  byte bVar1;
  size_type sVar2;
  byte *pbVar3;
  const_reference pvVar4;
  size_type sVar5;
  ulong uVar6;
  size_type sVar7;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  basic_string_view<char> bVar8;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  byte local_47c [2];
  anon_class_1_0_00000001 local_47a;
  v10 local_479;
  v10 *local_478;
  size_t local_470;
  string local_468;
  Error local_448;
  anon_class_1_0_00000001 local_41a;
  v10 local_419;
  v10 *local_418;
  size_t local_410;
  string local_408;
  Error local_3e8;
  anon_class_1_0_00000001 local_3ba;
  v10 local_3b9;
  v10 *local_3b8;
  size_t local_3b0;
  string local_3a8;
  Error local_388;
  anon_class_1_0_00000001 local_35a;
  v10 local_359;
  v10 *local_358;
  size_t local_350;
  string local_348;
  Error local_328;
  size_type local_300;
  size_t offset;
  undefined1 local_2e6 [8];
  Header header;
  size_t *aOffset_local;
  ByteArray *aBuf_local;
  Header *aHeader_local;
  Error *error;
  undefined1 local_2a0 [16];
  v10 *local_290;
  ulong local_288;
  v10 *local_280;
  size_t sStack_278;
  string *local_270;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_268 [3];
  undefined1 local_250 [16];
  v10 *local_240;
  ulong local_238;
  v10 *local_230;
  size_t sStack_228;
  string *local_220;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_218 [3];
  undefined1 local_200 [16];
  v10 *local_1f0;
  ulong local_1e8;
  v10 *local_1e0;
  size_t sStack_1d8;
  string *local_1d0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_1c8 [2];
  undefined1 local_1b8 [16];
  v10 *local_1a8;
  ulong local_1a0;
  v10 *local_198;
  size_t sStack_190;
  string *local_188;
  v10 *local_180;
  v10 **local_178;
  v10 *local_170;
  v10 **local_168;
  v10 *local_160;
  v10 **local_158;
  v10 *local_150;
  v10 **local_148;
  v10 **local_140;
  v10 *local_138;
  size_t sStack_130;
  v10 **local_120;
  v10 *local_118;
  size_t sStack_110;
  v10 **local_100;
  v10 *local_f8;
  size_t sStack_f0;
  v10 **local_e0;
  v10 *local_d8;
  size_t sStack_d0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_c8;
  undefined1 *local_c0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_b8;
  undefined8 local_b0;
  undefined1 *local_a8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_a0;
  undefined1 *local_98;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_90;
  undefined8 local_88;
  undefined1 *local_80;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_78;
  undefined1 *local_70;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_68;
  undefined8 local_60;
  undefined1 *local_58;
  Error **local_50;
  undefined1 *local_48;
  Error **local_40;
  undefined8 local_38;
  undefined1 *local_30;
  Error **local_28;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_20;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_18;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_10;
  
  header.mToken[1] = '\0';
  unique0x100006d3 = aOffset;
  Error::Error(__return_storage_ptr__);
  Header::Header((Header *)local_2e6);
  uVar6 = *stack0xfffffffffffffd28;
  local_300 = uVar6;
  sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(aBuf);
  if (uVar6 < sVar2) {
    pbVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](aBuf,local_300);
    local_2e6[0] = local_2e6[0] & 0xfc | (byte)((int)(uint)*pbVar3 >> 6);
    pbVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](aBuf,local_300);
    sVar2 = local_300;
    local_2e6[0] = local_2e6[0] & 0xf3 | ((byte)((int)(uint)*pbVar3 >> 4) & 3) << 2;
    local_300 = local_300 + 1;
    pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](aBuf,sVar2);
    sVar2 = local_300;
    local_2e6[0] = local_2e6[0] & 0xf | *pvVar4 << 4;
    sVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(aBuf);
    sVar7 = local_300;
    if (sVar2 < sVar5) {
      local_300 = local_300 + 1;
      pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](aBuf,sVar7);
      local_2e6[1] = *pvVar4;
      uVar6 = local_300 + 1;
      sVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(aBuf);
      sVar2 = local_300;
      if (uVar6 < sVar7) {
        local_300 = local_300 + 1;
        pbVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](aBuf,sVar2);
        sVar2 = local_300;
        bVar1 = *pbVar3;
        local_2e6._2_2_ = ZEXT12(bVar1);
        local_300 = local_300 + 1;
        pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](aBuf,sVar2);
        local_2e6._2_2_ = CONCAT11(bVar1,*pvVar4);
        if (local_2e6[0] >> 4 != 0) {
          uVar6 = local_300 + (local_2e6[0] >> 4);
          sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(aBuf);
          if (sVar2 < uVar6) {
            Deserialize::anon_class_1_0_00000001::operator()(&local_47a);
            local_148 = &local_478;
            local_150 = &local_479;
            bVar8 = ::fmt::v10::operator()(local_150);
            local_470 = bVar8.size_;
            local_478 = (v10 *)bVar8.data_;
            ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
            local_270 = &local_468;
            local_280 = local_478;
            sStack_278 = local_470;
            local_e0 = &local_280;
            local_290 = local_478;
            local_288 = local_470;
            local_d8 = local_290;
            sStack_d0 = local_288;
            error = (Error *)::fmt::v10::
                             make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>
                                       ();
            local_48 = local_2a0;
            local_50 = &error;
            local_38 = 0;
            fmt_02.size_ = 0;
            fmt_02.data_ = (char *)local_288;
            args_02.field_1.values_ = in_R9.values_;
            args_02.desc_ = (unsigned_long_long)local_50;
            local_40 = local_50;
            local_30 = local_48;
            local_28 = local_50;
            ::fmt::v10::vformat_abi_cxx11_(&local_468,local_290,fmt_02,args_02);
            Error::Error(&local_448,kBadFormat,&local_468);
            Error::operator=(__return_storage_ptr__,&local_448);
            Error::~Error(&local_448);
            std::__cxx11::string::~string((string *)&local_468);
            return __return_storage_ptr__;
          }
          pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                             (aBuf,local_300);
          local_47c[0] = local_2e6[0] >> 4;
          pbVar3 = std::min<unsigned_char>(local_47c,"\b");
          memcpy(local_2e6 + 4,pvVar4,(ulong)*pbVar3);
          local_300 = (local_2e6[0] >> 4) + local_300;
        }
        *(ulong *)aHeader =
             CONCAT44(local_2e6._4_4_,CONCAT22(local_2e6._2_2_,CONCAT11(local_2e6[1],local_2e6[0])))
        ;
        *(undefined4 *)(aHeader->mToken + 4) = header._0_4_;
        *stack0xfffffffffffffd28 = local_300;
      }
      else {
        Deserialize::anon_class_1_0_00000001::operator()(&local_41a);
        local_158 = &local_418;
        local_160 = &local_419;
        bVar8 = ::fmt::v10::operator()(local_160);
        local_410 = bVar8.size_;
        local_418 = (v10 *)bVar8.data_;
        ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
        local_220 = &local_408;
        local_230 = local_418;
        sStack_228 = local_410;
        local_100 = &local_230;
        local_240 = local_418;
        local_238 = local_410;
        local_f8 = local_240;
        sStack_f0 = local_238;
        local_268[0] = ::fmt::v10::
                       make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
        local_70 = local_250;
        local_78 = local_268;
        local_60 = 0;
        fmt_01.size_ = 0;
        fmt_01.data_ = (char *)local_238;
        args_01.field_1.values_ = in_R9.values_;
        args_01.desc_ = (unsigned_long_long)local_78;
        local_68 = local_78;
        local_58 = local_70;
        local_20 = local_78;
        ::fmt::v10::vformat_abi_cxx11_(&local_408,local_240,fmt_01,args_01);
        Error::Error(&local_3e8,kBadFormat,&local_408);
        Error::operator=(__return_storage_ptr__,&local_3e8);
        Error::~Error(&local_3e8);
        std::__cxx11::string::~string((string *)&local_408);
      }
    }
    else {
      Deserialize::anon_class_1_0_00000001::operator()(&local_3ba);
      local_168 = &local_3b8;
      local_170 = &local_3b9;
      bVar8 = ::fmt::v10::operator()(local_170);
      local_3b0 = bVar8.size_;
      local_3b8 = (v10 *)bVar8.data_;
      ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
      local_1d0 = &local_3a8;
      local_1e0 = local_3b8;
      sStack_1d8 = local_3b0;
      local_120 = &local_1e0;
      local_1f0 = local_3b8;
      local_1e8 = local_3b0;
      local_118 = local_1f0;
      sStack_110 = local_1e8;
      local_218[0] = ::fmt::v10::
                     make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
      local_98 = local_200;
      local_a0 = local_218;
      local_88 = 0;
      fmt_00.size_ = 0;
      fmt_00.data_ = (char *)local_1e8;
      args_00.field_1.values_ = in_R9.values_;
      args_00.desc_ = (unsigned_long_long)local_a0;
      local_90 = local_a0;
      local_80 = local_98;
      local_18 = local_a0;
      ::fmt::v10::vformat_abi_cxx11_(&local_3a8,local_1f0,fmt_00,args_00);
      Error::Error(&local_388,kBadFormat,&local_3a8);
      Error::operator=(__return_storage_ptr__,&local_388);
      Error::~Error(&local_388);
      std::__cxx11::string::~string((string *)&local_3a8);
    }
  }
  else {
    Deserialize::anon_class_1_0_00000001::operator()(&local_35a);
    local_178 = &local_358;
    local_180 = &local_359;
    bVar8 = ::fmt::v10::operator()(local_180);
    local_350 = bVar8.size_;
    local_358 = (v10 *)bVar8.data_;
    ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
    local_188 = &local_348;
    local_198 = local_358;
    sStack_190 = local_350;
    local_140 = &local_198;
    local_1a8 = local_358;
    local_1a0 = local_350;
    local_138 = local_1a8;
    sStack_130 = local_1a0;
    local_1c8[0] = ::fmt::v10::
                   make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
    local_c0 = local_1b8;
    local_c8 = local_1c8;
    local_b0 = 0;
    fmt.size_ = 0;
    fmt.data_ = (char *)local_1a0;
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)local_c8;
    local_b8 = local_c8;
    local_a8 = local_c0;
    local_10 = local_c8;
    ::fmt::v10::vformat_abi_cxx11_(&local_348,local_1a8,fmt,args);
    Error::Error(&local_328,kBadFormat,&local_348);
    Error::operator=(__return_storage_ptr__,&local_328);
    Error::~Error(&local_328);
    std::__cxx11::string::~string((string *)&local_348);
  }
  return __return_storage_ptr__;
}

Assistant:

Error Message::Deserialize(Header &aHeader, const ByteArray &aBuf, size_t &aOffset)
{
    Error  error;
    Header header;
    size_t offset = aOffset;

    VerifyOrExit(offset < aBuf.size(), error = ERROR_BAD_FORMAT("premature end of CoAP message header"));
    header.mVersion     = aBuf[offset] >> 6;
    header.mType        = aBuf[offset] >> 4;
    header.mTokenLength = aBuf[offset++];

    VerifyOrExit(offset < aBuf.size(), error = ERROR_BAD_FORMAT("premature end of CoAP message header"));
    header.mCode = aBuf[offset++];

    VerifyOrExit(offset + 1 < aBuf.size(), error = ERROR_BAD_FORMAT("premature end of CoAP message header"));
    header.mMessageId = aBuf[offset++];
    header.mMessageId = (header.mMessageId << 8) | aBuf[offset++];

    if (header.mTokenLength != 0)
    {
        VerifyOrExit(offset + header.mTokenLength <= aBuf.size(),
                     error = ERROR_BAD_FORMAT("premature end of CoAP message header"));
        memcpy(header.mToken, &aBuf[offset], std::min(header.mTokenLength, kMaxTokenLength));
        offset += header.mTokenLength;
    }

    aHeader = header;
    aOffset = offset;

exit:
    return error;
}